

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorProto_ExtensionRange::MergePartialFromCodedStream
          (DescriptorProto_ExtensionRange *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  DescriptorProto_ExtensionRange *this_local;
  uint32 local_50;
  uint32 local_3c;
  int32 *piStack_38;
  uint32 temp_1;
  CodedInputStream *local_30;
  undefined1 local_25;
  uint32 local_24;
  int32 *piStack_20;
  uint32 temp;
  CodedInputStream *local_18;
  undefined1 local_9;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_50 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_50 = input->last_tag_;
      }
      if (local_50 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_50);
      if (iVar3 != 1) break;
      WVar4 = internal::WireFormatLite::GetTagWireType(local_50);
      if (WVar4 == WIRETYPE_VARINT) {
        piStack_20 = &this->start_;
        local_18 = input;
        local_9 = io::CodedInputStream::ReadVarint32(input,&local_24);
        if (!(bool)local_9) {
          return false;
        }
        *piStack_20 = local_24;
        set_has_start(this);
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x10')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (bVar1) goto LAB_002f2360;
      }
      else {
LAB_002f23cd:
        WVar4 = internal::WireFormatLite::GetTagWireType(local_50);
        if (WVar4 == WIRETYPE_END_GROUP) {
          return true;
        }
        unknown_fields = mutable_unknown_fields(this);
        bVar1 = internal::WireFormat::SkipField(input,local_50,unknown_fields);
        if (!bVar1) {
          return false;
        }
      }
    }
    if ((iVar3 != 2) ||
       (WVar4 = internal::WireFormatLite::GetTagWireType(local_50), WVar4 != WIRETYPE_VARINT))
    goto LAB_002f23cd;
LAB_002f2360:
    piStack_38 = &this->end_;
    local_30 = input;
    local_25 = io::CodedInputStream::ReadVarint32(input,&local_3c);
    if (!(bool)local_25) {
      return false;
    }
    *piStack_38 = local_3c;
    set_has_end(this);
    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
    if (bVar1) {
      return true;
    }
  } while( true );
}

Assistant:

bool DescriptorProto_ExtensionRange::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 start = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &start_)));
          set_has_start();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_end;
        break;
      }

      // optional int32 end = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_end:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &end_)));
          set_has_end();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}